

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O0

double __thiscall
VariationalBayesEstimatorOnLDA::calculateVariationalLowerBound(VariationalBayesEstimatorOnLDA *this)

{
  double dVar1;
  uint uVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  type tVar9;
  type tVar10;
  double dVar11;
  double variationalLowerBound;
  int k_2;
  uint v_1;
  int l;
  int d_1;
  double term3;
  uint local_38;
  int k_1;
  int d;
  uint local_28;
  uint local_24;
  int v;
  int k;
  double term2;
  double term1;
  VariationalBayesEstimatorOnLDA *this_local;
  
  term2 = 0.0;
  _v = 0.0;
  for (local_24 = 0; local_24 < this->_K; local_24 = local_24 + 1) {
    tVar9 = boost::math::lgamma<double>(this->_betaSum);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->_nk,(long)(int)local_24);
    tVar10 = boost::math::lgamma<double>(*pvVar3 + this->_betaSum);
    term2 = (tVar9 - tVar10) + term2;
    for (local_28 = 0; local_28 < this->_V; local_28 = local_28 + 1) {
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_nkv,(long)(int)local_24);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)(int)local_28);
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->_beta,(long)(int)local_28);
      tVar9 = boost::math::lgamma<double>(dVar1 + *pvVar3);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->_beta,(long)(int)local_28);
      tVar10 = boost::math::lgamma<double>(*pvVar3);
      term2 = (tVar9 - tVar10) + term2;
    }
  }
  for (local_38 = 0; local_38 < this->_D; local_38 = local_38 + 1) {
    tVar9 = boost::math::lgamma<double>(this->_alphaSum);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->_nd,(long)(int)local_38);
    tVar10 = boost::math::lgamma<double>(*pvVar3 + this->_alphaSum);
    _v = (tVar9 - tVar10) + _v;
    for (term3._4_4_ = 0; term3._4_4_ < this->_K; term3._4_4_ = term3._4_4_ + 1) {
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_ndk,(long)(int)local_38);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (pvVar4,(long)(int)term3._4_4_);
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->_alpha,(long)(int)term3._4_4_);
      tVar9 = boost::math::lgamma<double>(dVar1 + *pvVar3);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->_alpha,(long)(int)term3._4_4_);
      tVar10 = boost::math::lgamma<double>(*pvVar3);
      _v = (tVar9 - tVar10) + _v;
    }
  }
  _l = 0.0;
  for (v_1 = 0; sVar5 = std::
                        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ::size(this->_docVoca), (ulong)(long)(int)v_1 < sVar5; v_1 = v_1 + 1) {
    k_2 = 0;
    while( true ) {
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](this->_docVoca,(long)(int)v_1);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar6);
      if (sVar5 <= (ulong)(long)k_2) break;
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](this->_docVoca,(long)(int)v_1);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar6,(long)k_2);
      uVar2 = *pvVar7;
      for (variationalLowerBound._0_4_ = 0; variationalLowerBound._0_4_ < this->_K;
          variationalLowerBound._0_4_ = variationalLowerBound._0_4_ + 1) {
        pvVar8 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[](&this->_qz,(long)(int)v_1);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar8,(long)k_2);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar4,(long)(int)variationalLowerBound._0_4_);
        if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
          pvVar8 = std::
                   vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   ::operator[](&this->_qz,(long)(int)v_1);
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](pvVar8,(long)k_2);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (pvVar4,(long)(int)variationalLowerBound._0_4_);
          dVar1 = *pvVar3;
          pvVar8 = std::
                   vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   ::operator[](&this->_qz,(long)(int)v_1);
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](pvVar8,(long)k_2);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (pvVar4,(long)(int)variationalLowerBound._0_4_);
          dVar11 = log(*pvVar3);
          pvVar6 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[](this->_frequencyMatrix,(long)(int)v_1);
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (pvVar6,(ulong)uVar2);
          _l = dVar1 * dVar11 * (double)*pvVar7 + _l;
        }
      }
      k_2 = k_2 + 1;
    }
  }
  return (term2 + _v) - _l;
}

Assistant:

double VariationalBayesEstimatorOnLDA::calculateVariationalLowerBound()const{//{{{
    double term1=0, term2=0;
    for(int k=0; k<_K; k++){
        term1 += boost::math::lgamma(_betaSum) - boost::math::lgamma(_nk[k]+_betaSum);
        for(int v=0; v<_V; v++){
            try{
                term1 += boost::math::lgamma(_nkv[k][v]+_beta[v]) - boost::math::lgamma(_beta[v]);
            }catch(...){
                term1 += 0;
            }
        }
    }
    for(int d=0; d<_D; d++){
        term2 += boost::math::lgamma(_alphaSum) - boost::math::lgamma(_nd[d]+_alphaSum);
        for(int k=0; k<_K; k++){
        //ndk == 0 -> alphak == 0  lgamma(0) - lgamma(0) = 0
            try{
                term2 += boost::math::lgamma(_ndk[d][k]+_alpha[k]) - boost::math::lgamma(_alpha[k]);
            }catch(...){
                term2 += 0;
            }
        }
    }
    double term3 = 0;
    for(int d=0;d<_docVoca.size();d++){
        for(int l=0; l<_docVoca[d].size(); l++){
            unsigned int v = _docVoca[d][l];
            for(int k=0; k<_K; k++){
                if(_qz[d][l][k] != 0){
                    term3 += _qz[d][l][k] * log(_qz[d][l][k]) * _frequencyMatrix[d][v];
                }
            }
        }
    }
    double variationalLowerBound = term1 + term2 - term3;
    return(variationalLowerBound);
}